

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

char * deqp::gles3::Functional::anon_unknown_2::getQueryTypeSuffix(QueryType type)

{
  char *pcStack_10;
  QueryType type_local;
  
  switch(type) {
  case QUERY_BOOLEAN:
    pcStack_10 = "_getboolean";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case QUERY_INTEGER:
    pcStack_10 = "_getinteger";
    break;
  case QUERY_INTEGER64:
    pcStack_10 = "_getinteger64";
    break;
  case QUERY_FLOAT:
    pcStack_10 = "_getfloat";
  }
  return pcStack_10;
}

Assistant:

static const char* getQueryTypeSuffix (QueryType type)
{
	switch (type)
	{
		case QUERY_BOOLEAN:		return "_getboolean";
		case QUERY_INTEGER:		return "_getinteger";
		case QUERY_INTEGER64:	return "_getinteger64";
		case QUERY_FLOAT:		return "_getfloat";
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}